

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
pdqsort_detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (uint *begin,uint *end,uint *param_3)

{
  uint *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint *puVar11;
  int __tmp;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  ulong uVar15;
  undefined1 *puVar16;
  uint *puVar17;
  byte *pbVar18;
  uint *puVar19;
  uint *puVar20;
  uint *puVar21;
  byte *pbVar22;
  uint *puVar23;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar24;
  uchar offsets_l_storage [128];
  long local_178;
  byte local_101 [128];
  byte abStack_81 [81];
  
  uVar5 = *begin;
  lVar8 = 0;
  do {
    uVar6 = *(uint *)((long)begin + lVar8 + 4);
    lVar8 = lVar8 + 4;
  } while ((int)uVar6 < (int)uVar5);
  puVar1 = (uint *)((long)begin + lVar8);
  puVar17 = end;
  if (lVar8 == 4) {
    do {
      if (end <= puVar1) break;
      puVar17 = end + -1;
      puVar13 = end + -1;
      end = puVar17;
    } while ((int)uVar5 <= (int)*puVar13);
  }
  else {
    do {
      end = puVar17 + -1;
      puVar13 = puVar17 + -1;
      puVar17 = end;
    } while ((int)uVar5 <= (int)*puVar13);
  }
  puVar17 = puVar1;
  if (puVar1 < end) {
    param_3 = (uint *)(ulong)*end;
    puVar17 = (uint *)((long)begin + lVar8) + 1;
    *(uint *)((long)begin + lVar8) = *end;
    *end = uVar6;
    if (puVar17 < end) {
      pbVar22 = abStack_81 + 1;
      pbVar18 = local_101 + 1;
      local_178 = 0;
      puVar21 = (uint *)0x0;
      puVar19 = (uint *)0x0;
      lVar8 = 0;
      puVar13 = end;
      puVar14 = end;
      puVar23 = puVar17;
      do {
        uVar9 = (long)puVar13 - (long)puVar17 >> 2;
        uVar10 = uVar9 >> (puVar21 == (uint *)0x0);
        if (puVar19 != (uint *)0x0) {
          uVar10 = 0;
        }
        uVar9 = uVar9 - uVar10;
        if (puVar21 != (uint *)0x0) {
          uVar9 = 0;
        }
        if (uVar10 < 0x40) {
          param_3 = puVar19;
          if (uVar10 != 0) {
            lVar12 = 0;
            uVar15 = 0;
            do {
              pbVar22[(long)puVar19] = (byte)uVar15;
              puVar11 = puVar17 + uVar15;
              uVar15 = uVar15 + 1;
              puVar19 = (uint *)((ulong)((int)uVar5 <= (int)*puVar11) + (long)puVar19);
              lVar12 = lVar12 + -4;
            } while (uVar10 != uVar15);
            puVar17 = (uint *)((long)puVar17 - lVar12);
            param_3 = puVar19;
          }
        }
        else {
          lVar12 = 0;
          uVar10 = 0xfffffffffffffff8;
          do {
            uVar15 = uVar10 + 8;
            pbVar22[(long)puVar19] = (byte)uVar15;
            puVar16 = (undefined1 *)
                      ((ulong)((int)uVar5 <= (int)puVar17[uVar10 + 8]) + (long)puVar19);
            cVar7 = (char)uVar10;
            pbVar22[(long)puVar16] = cVar7 + 9;
            puVar16 = puVar16 + ((int)uVar5 <= (int)puVar17[uVar10 + 9]);
            pbVar22[(long)puVar16] = cVar7 + 10;
            puVar16 = puVar16 + ((int)uVar5 <= (int)puVar17[uVar10 + 10]);
            pbVar22[(long)puVar16] = cVar7 + 0xb;
            puVar16 = puVar16 + ((int)uVar5 <= (int)puVar17[uVar10 + 0xb]);
            pbVar22[(long)puVar16] = cVar7 + 0xc;
            puVar16 = puVar16 + ((int)uVar5 <= (int)puVar17[uVar10 + 0xc]);
            pbVar22[(long)puVar16] = cVar7 + 0xd;
            puVar16 = puVar16 + ((int)uVar5 <= (int)puVar17[uVar10 + 0xd]);
            pbVar22[(long)puVar16] = cVar7 + 0xe;
            uVar6 = puVar17[uVar10 + 0xe];
            pbVar22[(long)(puVar16 + ((int)uVar5 <= (int)uVar6))] = cVar7 + 0xf;
            puVar19 = (uint *)(puVar16 + ((int)uVar5 <= (int)uVar6) +
                              ((int)uVar5 <= (int)puVar17[uVar10 + 0xf]));
            lVar12 = lVar12 + 0x20;
            uVar10 = uVar15;
          } while (uVar15 < 0x38);
          puVar17 = (uint *)((long)puVar17 + lVar12);
          param_3 = puVar19;
        }
        if (uVar9 < 0x40) {
          if (uVar9 != 0) {
            uVar10 = 0;
            puVar19 = puVar13;
            do {
              uVar10 = uVar10 + 1;
              pbVar18[(long)puVar21] = (byte)uVar10;
              puVar13 = puVar19 + -1;
              puVar21 = (uint *)((long)puVar21 + (ulong)((int)puVar19[-1] < (int)uVar5));
              puVar19 = puVar13;
            } while (uVar9 != uVar10);
          }
        }
        else {
          uVar10 = 0xfffffffffffffff8;
          puVar19 = puVar13;
          do {
            cVar7 = (char)uVar10;
            pbVar18[(long)puVar21] = cVar7 + 9;
            puVar16 = (undefined1 *)((ulong)((int)puVar19[-1] < (int)uVar5) + (long)puVar21);
            pbVar18[(long)puVar16] = cVar7 + 10;
            puVar16 = puVar16 + ((int)puVar19[-2] < (int)uVar5);
            pbVar18[(long)puVar16] = cVar7 + 0xb;
            puVar16 = puVar16 + ((int)puVar19[-3] < (int)uVar5);
            pbVar18[(long)puVar16] = cVar7 + 0xc;
            puVar16 = puVar16 + ((int)puVar19[-4] < (int)uVar5);
            pbVar18[(long)puVar16] = cVar7 + 0xd;
            puVar16 = puVar16 + ((int)puVar19[-5] < (int)uVar5);
            pbVar18[(long)puVar16] = cVar7 + 0xe;
            puVar16 = puVar16 + ((int)puVar19[-6] < (int)uVar5);
            pbVar18[(long)puVar16] = cVar7 + 0xf;
            uVar6 = puVar19[-7];
            pbVar18[(long)(puVar16 + ((int)uVar6 < (int)uVar5))] = cVar7 + 0x10;
            puVar13 = puVar19 + -8;
            puVar21 = (uint *)(puVar16 + ((int)uVar6 < (int)uVar5) + ((int)puVar19[-8] < (int)uVar5)
                              );
            uVar10 = uVar10 + 8;
            puVar19 = puVar13;
          } while (uVar10 < 0x38);
        }
        puVar11 = param_3;
        if (puVar21 < param_3) {
          puVar11 = puVar21;
        }
        pbVar2 = pbVar22 + local_178;
        pbVar3 = pbVar18 + lVar8;
        if (param_3 == puVar21) {
          if (puVar11 != (uint *)0x0) {
            puVar19 = (uint *)0x0;
            do {
              bVar4 = pbVar3[(long)puVar19];
              uVar6 = puVar23[pbVar2[(long)puVar19]];
              puVar23[pbVar2[(long)puVar19]] = puVar14[-(ulong)bVar4];
              puVar14[-(ulong)bVar4] = uVar6;
              puVar19 = (uint *)((long)puVar19 + 1);
            } while (puVar11 != puVar19);
          }
        }
        else if (puVar11 != (uint *)0x0) {
          puVar19 = puVar14 + -(ulong)*pbVar3;
          uVar6 = puVar23[*pbVar2];
          puVar23[*pbVar2] = *puVar19;
          if (puVar11 != (uint *)&DAT_00000001) {
            puVar20 = (uint *)&DAT_00000001;
            do {
              bVar4 = pbVar2[(long)puVar20];
              *puVar19 = puVar23[bVar4];
              puVar19 = puVar14 + -(ulong)pbVar3[(long)puVar20];
              puVar23[bVar4] = *puVar19;
              puVar20 = (uint *)((long)puVar20 + 1);
            } while (puVar11 != puVar20);
          }
          *puVar19 = uVar6;
        }
        puVar19 = (uint *)((long)param_3 - (long)puVar11);
        local_178 = local_178 + (long)puVar11;
        lVar8 = lVar8 + (long)puVar11;
        if (param_3 <= puVar21) {
          local_178 = 0;
          puVar23 = puVar17;
        }
        puVar21 = (uint *)((long)puVar21 - (long)puVar11);
        if (puVar21 == (uint *)0x0) {
          lVar8 = 0;
          puVar14 = puVar13;
        }
      } while (puVar17 < puVar13);
      if (puVar19 != (uint *)0x0) {
        do {
          puVar17 = puVar13 + -1;
          uVar6 = puVar23[(abStack_81 + local_178)[(long)puVar19]];
          param_3 = (uint *)(ulong)uVar6;
          puVar23[(abStack_81 + local_178)[(long)puVar19]] = puVar13[-1];
          puVar13[-1] = uVar6;
          puVar19 = (uint *)((long)puVar19 + -1);
          puVar13 = puVar17;
        } while (puVar19 != (uint *)0x0);
      }
      if (puVar21 != (uint *)0x0) {
        puVar13 = puVar17;
        do {
          param_3 = puVar14 + -(ulong)(local_101 + lVar8)[(long)puVar21];
          puVar17 = puVar13 + 1;
          uVar6 = *param_3;
          *param_3 = *puVar13;
          *puVar13 = uVar6;
          puVar21 = (uint *)((long)puVar21 + -1);
          puVar13 = puVar17;
        } while (puVar21 != (uint *)0x0);
      }
    }
  }
  pVar24._9_7_ = (undefined7)((ulong)param_3 >> 8);
  pVar24.second = end <= puVar1;
  *begin = puVar17[-1];
  puVar17[-1] = uVar5;
  pVar24.first._M_current = (int *)(puVar17 + -1);
  return pVar24;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }